

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int setup_initial_encryption
              (ptls_cipher_suite_t *cs,st_quicly_cipher_context_t *ingress,
              st_quicly_cipher_context_t *egress,ptls_iovec_t cid,int is_client,ptls_iovec_t salt,
              quicly_conn_t *conn)

{
  int iVar1;
  uint8_t secret [64];
  
  iVar1 = ptls_hkdf_extract(cs->hash,secret,salt,cid);
  if (iVar1 == 0) {
    if (ingress == (st_quicly_cipher_context_t *)0x0) {
      if (egress == (st_quicly_cipher_context_t *)0x0) {
        iVar1 = 0;
        goto LAB_00118b90;
      }
    }
    else {
      iVar1 = setup_initial_key(ingress,cs,secret,setup_initial_encryption::labels[(uint)is_client],
                                0,conn);
      if (egress == (st_quicly_cipher_context_t *)0x0 || iVar1 != 0) goto LAB_00118b90;
    }
    iVar1 = setup_initial_key(egress,cs,secret,setup_initial_encryption::labels[is_client == 0],1,
                              conn);
    if ((ingress != (st_quicly_cipher_context_t *)0x0) && (iVar1 != 0)) {
      dispose_cipher(ingress);
    }
  }
LAB_00118b90:
  (*ptls_clear_memory)(secret,0x40);
  return iVar1;
}

Assistant:

static int setup_initial_encryption(ptls_cipher_suite_t *cs, struct st_quicly_cipher_context_t *ingress,
                                    struct st_quicly_cipher_context_t *egress, ptls_iovec_t cid, int is_client, ptls_iovec_t salt,
                                    quicly_conn_t *conn)
{
    static const char *labels[2] = {"client in", "server in"};
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    /* extract master secret */
    if ((ret = ptls_hkdf_extract(cs->hash, secret, salt, cid)) != 0)
        goto Exit;

    /* create aead contexts */
    if (ingress != NULL && (ret = setup_initial_key(ingress, cs, secret, labels[is_client], 0, conn)) != 0)
        goto Exit;
    if (egress != NULL && (ret = setup_initial_key(egress, cs, secret, labels[!is_client], 1, conn)) != 0) {
        if (ingress != NULL)
            dispose_cipher(ingress);
        goto Exit;
    }

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}